

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O1

bool Memory::StandAloneFreeListPolicy::TryEnsureFreeListEntry(StandAloneFreeListPolicy **_this)

{
  uint uVar1;
  StandAloneFreeListPolicy *pSVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  StandAloneFreeListPolicy *pSVar7;
  bool bVar8;
  uint uVar9;
  
  pSVar2 = *_this;
  bVar8 = true;
  if (pSVar2->freeList == 0) {
    uVar1 = pSVar2->used;
    if (uVar1 < pSVar2->allocated) {
      pSVar2->used = uVar1 + 1;
      pSVar2->freeList = uVar1 + 1;
    }
    else {
      if (uVar1 != pSVar2->allocated) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                           ,0x3dc,"(_this->used == _this->allocated)",
                           "_this->used == _this->allocated");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      pSVar2 = *_this;
      uVar1 = pSVar2->allocated;
      uVar9 = 0x400;
      if (uVar1 < 0x400) {
        uVar9 = uVar1;
      }
      pSVar7 = NewInternal(uVar9 + uVar1);
      if (pSVar7 == (StandAloneFreeListPolicy *)0x0) {
        bVar8 = false;
      }
      else {
        js_memcpy_s(pSVar7->freeObjectLists,0x100,pSVar2->freeObjectLists,0x100);
        js_memcpy_s(pSVar7->entries,(ulong)pSVar7->allocated << 4,pSVar2->entries,
                    (ulong)pSVar2->used << 4);
        uVar5 = pSVar2->used + 1;
        pSVar7->used = uVar5;
        pSVar7->freeList = uVar5;
        *_this = pSVar7;
        DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::StandAloneFreeListPolicy>
                  (&HeapAllocator::Instance,pSVar2,(ulong)(pSVar2->allocated * 0x10 + 0x100));
      }
    }
  }
  return bVar8;
}

Assistant:

bool StandAloneFreeListPolicy::TryEnsureFreeListEntry(StandAloneFreeListPolicy *& _this)
{
    if (0 == _this->freeList)
    {
        if (_this->used < _this->allocated)
        {
            _this->used++;
            _this->freeList = _this->used;
        }
        else
        {
            Assert(_this->used == _this->allocated);

            StandAloneFreeListPolicy * oldThis = _this;
            uint entries = oldThis->allocated + min(oldThis->allocated, MaxEntriesGrowth);
            StandAloneFreeListPolicy * newThis = NewInternal(entries);
            if (NULL != newThis)
            {
                uint sizeInBytes = buckets * sizeof(uint);
                js_memcpy_s(newThis->freeObjectLists, sizeInBytes, oldThis->freeObjectLists, sizeInBytes);
                js_memcpy_s(newThis->entries, newThis->allocated * sizeof(FreeObjectListEntry), oldThis->entries, oldThis->used * sizeof(FreeObjectListEntry));
                newThis->used = oldThis->used + 1;
                newThis->freeList = newThis->used;
                _this = newThis;
                HeapDeletePlus(GetPlusSize(oldThis), oldThis);
            }
            else
            {
                return false;
            }
        }
    }

    return true;
}